

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::attachmentQueryRboTest(TestContext *testCtx,Context *ctx)

{
  undefined4 local_1c;
  Context *pCStack_18;
  GLint unused;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  pCStack_18 = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  (*pCStack_18->_vptr_Context[0xc])(pCStack_18,0x8d41,3);
  (*pCStack_18->_vptr_Context[0x20])(pCStack_18,0x8d40,0x8d20,0x8d41,3);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd0,0x8d41);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8d20,0x8cd1,3);
  local_1c = 0;
  (*pCStack_18->_vptr_Context[0x22])(pCStack_18,0x8d40,0x8d20,0x8cd2,&local_1c);
  checkError((TestContext *)ctx_local,pCStack_18,0x500);
  (*pCStack_18->_vptr_Context[0x22])(pCStack_18,0x8d40,0x8d20,0x8cd3,&local_1c);
  checkError((TestContext *)ctx_local,pCStack_18,0x500);
  return;
}

Assistant:

static void attachmentQueryRboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	ctx.bindRenderbuffer(GL_RENDERBUFFER, 3);
	ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 3);

	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
	checkFboAttachmentParam(testCtx, ctx, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 3);

	GLint unused = 0;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkError(testCtx, ctx, GL_INVALID_ENUM);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkError(testCtx, ctx, GL_INVALID_ENUM);
}